

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmp_stream.c
# Opt level: O2

yabmp_status yabmp_file_seek(void *context,yabmp_uint32 offset)

{
  int iVar1;
  
  if (context != (void *)0x0) {
    iVar1 = fseek((FILE *)context,(ulong)offset,0);
    return (yabmp_status)(iVar1 != 0);
  }
  __assert_fail("l_file != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/lib/yabmp/src/yabmp_stream.c"
                ,0x32,"yabmp_status yabmp_file_seek(void *, yabmp_uint32)");
}

Assistant:

static yabmp_status yabmp_file_seek(void* context, yabmp_uint32 offset)
{
	FILE* l_file = (FILE*)context;
	yabmp_status l_status = YABMP_OK;
	
	assert(l_file != NULL);
	
#if LONG_MAX < 0xFFFFFFFFU
	if (offset > LONG_MAX) {
		return YABMP_ERR_UNKNOW;
	}
#endif
	
	if (fseek(l_file, (long)offset, SEEK_SET) != 0) {
		l_status = YABMP_ERR_UNKNOW;
	}
	return l_status;
}